

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3Codec.cpp
# Opt level: O0

int __thiscall MP3Codec::mp3DecodeFrame(MP3Codec *this,uint8_t *buff,uint8_t *end)

{
  sbyte sVar1;
  uint32_t uVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  uint uStack_30;
  uint8_t padding;
  uint32_t header;
  int lsf;
  int mpeg25;
  uint8_t *end_local;
  uint8_t *buff_local;
  MP3Codec *this_local;
  
  if ((long)end - (long)buff < 4) {
    this_local._4_4_ = 0;
  }
  else {
    uVar2 = my_ntohl(*(uint32_t *)buff);
    bVar5 = (uVar2 & 0x100000) == 0;
    if (bVar5) {
      uStack_30 = 1;
    }
    else {
      uStack_30 = (uint)((uVar2 & 0x80000) == 0);
    }
    this->m_layer = '\x04' - ((byte)(uVar2 >> 0x11) & 3);
    if (this->m_layer == '\x04') {
      this_local._4_4_ = 0;
    }
    else {
      this->m_sample_rate_index = (byte)(uVar2 >> 10) & 3;
      if (this->m_sample_rate_index == '\x03') {
        this_local._4_4_ = 0;
      }
      else {
        sVar1 = (sbyte)uStack_30;
        this->m_sample_rate = (int)(uint)ff_mpa_freq_tab[this->m_sample_rate_index] >> sVar1 + bVar5
        ;
        this->m_sample_rate_index = this->m_sample_rate_index + (sVar1 + bVar5) * '\x03';
        this->m_bitrate_index = (byte)(uVar2 >> 0xc) & 0xf;
        if (this->m_bitrate_index == '\x0f') {
          this_local._4_4_ = 0;
        }
        else {
          bVar3 = (byte)(uVar2 >> 9) & 1;
          this->m_mode = (byte)(uVar2 >> 6) & 3;
          this->m_mode_ext = (byte)(uVar2 >> 4) & 3;
          iVar4 = 2;
          if (this->m_mode == '\x03') {
            iVar4 = 1;
          }
          this->m_nb_channels = iVar4;
          if (this->m_bitrate_index == '\0') {
            this_local._4_4_ = 0;
          }
          else {
            this->m_frame_size =
                 (uint)*(ushort *)
                        ("21MovParsedSRTTrackData" +
                        (ulong)this->m_bitrate_index * 2 +
                        (long)(int)uStack_30 * 0x5a + (long)this->m_layer * 0x1e + 0x17);
            this->m_bit_rate = this->m_frame_size * 1000;
            if (this->m_layer == '\x01') {
              this->m_samples = 0x180;
              this->m_frame_size = (this->m_frame_size * 12000) / this->m_sample_rate;
              this->m_frame_size = (this->m_frame_size + (uint)bVar3) * 4;
            }
            else if (this->m_layer == '\x02') {
              this->m_samples = 0x480;
              this->m_frame_size = (this->m_frame_size * 0x23280) / this->m_sample_rate;
              this->m_frame_size = (uint)bVar3 + this->m_frame_size;
            }
            else {
              this->m_samples = 0x480;
              this->m_frame_size = (this->m_frame_size * 0x23280) / (this->m_sample_rate << sVar1);
              this->m_frame_size = (uint)bVar3 + this->m_frame_size;
            }
            this_local._4_4_ = this->m_frame_size;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int MP3Codec::mp3DecodeFrame(uint8_t* buff, const uint8_t* end)
{
    // int sample_rate, frame_size, mpeg25, padding;
    // int sample_rate_index, bitrate_index;
    int mpeg25, lsf;
    if (end - buff < 4)
        return 0;
    const uint32_t header = my_ntohl(*reinterpret_cast<uint32_t*>(buff));
    if (header & (1 << 20))
    {
        lsf = (header & (1 << 19)) ? 0 : 1;
        mpeg25 = 0;
    }
    else
    {
        lsf = 1;
        mpeg25 = 1;
    }

    m_layer = static_cast<int8_t>(4 - ((header >> 17) & 3));
    if (m_layer == 4)
        return 0;
    /* extract frequency */
    m_sample_rate_index = static_cast<uint8_t>((header >> 10) & 3);
    if (m_sample_rate_index == 3)
        return 0;  // invalid sample rate
    m_sample_rate = ff_mpa_freq_tab[m_sample_rate_index] >> (lsf + mpeg25);
    m_sample_rate_index += 3 * (lsf + mpeg25);
    // error_protection = ((header >> 16) & 1) ^ 1;

    m_bitrate_index = static_cast<uint8_t>((header >> 12) & 0xf);
    if (m_bitrate_index == 15)
        return 0;  // invalid bitrate index
    const auto padding = static_cast<uint8_t>((header >> 9) & 1);
    // extension = (header >> 8) & 1;
    m_mode = static_cast<uint8_t>((header >> 6) & 3);
    m_mode_ext = static_cast<uint8_t>((header >> 4) & 3);
    // copyright = (header >> 3) & 1;
    // original = (header >> 2) & 1;
    // emphasis = header & 3;

    m_nb_channels = (m_mode == MPA_MONO) ? 1 : 2;

    if (m_bitrate_index != 0)
    {
        m_frame_size = ff_mpa_bitrate_tab[lsf][m_layer - 1][m_bitrate_index];
        m_bit_rate = m_frame_size * 1000;
        switch (m_layer)
        {
        case 1:
            m_samples = 384;
            m_frame_size = (m_frame_size * 12000) / m_sample_rate;
            m_frame_size = (m_frame_size + padding) * 4;
            break;
        case 2:
            m_samples = 1152;
            m_frame_size = (m_frame_size * 144000) / m_sample_rate;
            m_frame_size += padding;
            break;
        default:
        case 3:
            m_samples = 1152;
            m_frame_size = (m_frame_size * 144000) / (m_sample_rate << lsf);
            m_frame_size += padding;
            break;
        }
    }
    else
    {
        /* if no frame size computed, signal it */
        return 0;
    }
    return m_frame_size;
}